

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getEnormousString
          (TestMoreStuffImpl *this,GetEnormousStringContext context)

{
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,_capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>
  local_70;
  Builder local_68;
  Maybe<capnp::MessageSize> local_50;
  Builder local_38;
  
  local_50.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,_capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>
  ::getResults(&local_38,&local_70,&local_50);
  capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults::Builder::initStr
            (&local_68,&local_38,100000000);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getEnormousString(GetEnormousStringContext context) {
  context.getResults().initStr(100000000);  // 100MB
  return kj::READY_NOW;
}